

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall helics::apps::App::loadInputFiles(App *this)

{
  bool bVar1;
  bool in_stack_00000027;
  string *in_stack_00000028;
  App *in_stack_00000030;
  
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x24a07c);
  if (!bVar1) {
    loadFile(in_stack_00000030,in_stack_00000028,in_stack_00000027);
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x24a0a1);
  if (!bVar1) {
    loadFile(in_stack_00000030,in_stack_00000028,in_stack_00000027);
  }
  return;
}

Assistant:

void App::loadInputFiles()
{
    if (!configFileName.empty()) {
        /** this one would have been loaded through the federate already*/
        loadFile(configFileName, false);
    }
    if (!inputFileName.empty()) {
        loadFile(inputFileName, true);
    }
}